

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitcoin-cli.cpp
# Opt level: O1

UniValue * __thiscall
GenerateToAddressRequestHandler::ProcessReply
          (UniValue *__return_storage_ptr__,GenerateToAddressRequestHandler *this,UniValue *reply)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  string key;
  string key_00;
  UniValue result_00;
  UniValue val;
  UniValue val_00;
  UniValue error;
  optional<UniValue> id;
  UniValue *pUVar3;
  long in_FS_OFFSET;
  UniValue result;
  undefined1 in_stack_fffffffffffffd30 [24];
  undefined1 auVar4 [32];
  undefined1 in_stack_fffffffffffffd48 [56];
  undefined8 in_stack_fffffffffffffd80;
  bool in_stack_fffffffffffffd88;
  bool bVar5;
  undefined7 in_stack_fffffffffffffd89;
  undefined4 in_stack_fffffffffffffd90;
  VType VVar6;
  undefined4 in_stack_fffffffffffffd94;
  pointer in_stack_fffffffffffffd98;
  undefined1 *puVar7;
  undefined8 in_stack_fffffffffffffda0;
  long in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdb0 [40];
  undefined1 in_stack_fffffffffffffdd8 [16];
  VType VVar8;
  undefined4 in_stack_fffffffffffffdec;
  _Alloc_hider _Var9;
  size_type sVar10;
  undefined8 uVar11;
  undefined8 in_stack_fffffffffffffe08;
  pointer pbVar12;
  pointer pbVar13;
  pointer pbVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  string local_1c0;
  VType local_1a0;
  long *local_198 [2];
  long local_188 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_178;
  vector<UniValue,_std::allocator<UniValue>_> local_160;
  long *local_148 [2];
  long local_138 [2];
  UniValue local_128;
  long *local_d0 [2];
  long local_c0 [2];
  undefined1 *local_b0;
  undefined8 local_a8;
  undefined1 local_a0 [9];
  undefined4 local_97;
  undefined2 local_93;
  char local_91;
  UniValue local_90;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0 = local_a0;
  local_a8 = 0;
  paVar1 = &local_90.val.field_2;
  local_90.typ = VOBJ;
  local_90.val.field_2._M_local_buf[0] = '\0';
  local_90.val.field_2._M_allocated_capacity._1_7_ = (undefined7)local_a0._1_8_;
  local_90.val.field_2._M_local_buf[8] = SUB81(local_a0._1_8_,7);
  local_90.val.field_2._9_4_ = local_97;
  local_90.val.field_2._13_2_ = local_93;
  local_90.val.field_2._M_local_buf[0xf] = local_91;
  local_90.val._M_string_length = 0;
  local_a0[0] = 0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0[0] = local_c0;
  local_90.val._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"address","");
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_128,&this->address_str);
  key._M_string_length = in_stack_fffffffffffffd30._0_8_;
  key.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 )in_stack_fffffffffffffd30._8_16_;
  key._M_dataplus._M_p = (pointer)__return_storage_ptr__;
  val.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffd80;
  auVar4 = in_stack_fffffffffffffd48._8_32_;
  val.typ = in_stack_fffffffffffffd48._0_4_;
  val._4_4_ = in_stack_fffffffffffffd48._4_4_;
  val.val._M_dataplus._M_p = (pointer)auVar4._0_8_;
  val.val._M_string_length = auVar4._8_8_;
  val.val.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar4._16_16_;
  val.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffd48._40_8_;
  val.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd48._48_8_;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_start._0_1_ = in_stack_fffffffffffffd88;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_start._1_7_ = in_stack_fffffffffffffd89;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_finish._0_4_ = in_stack_fffffffffffffd90;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_finish._4_4_ = in_stack_fffffffffffffd94;
  val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffffd98;
  UniValue::pushKV(&local_90,key,val);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_128.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_128.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128.val._M_dataplus._M_p != &local_128.val.field_2) {
    operator_delete(local_128.val._M_dataplus._M_p,local_128.val.field_2._M_allocated_capacity + 1);
  }
  if (local_d0[0] != local_c0) {
    operator_delete(local_d0[0],local_c0[0] + 1);
  }
  local_148[0] = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"blocks","");
  pUVar3 = UniValue::get_obj(reply);
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"result","");
  pUVar3 = UniValue::operator[](pUVar3,&local_1c0);
  local_1a0 = pUVar3->typ;
  local_198[0] = local_188;
  pcVar2 = (pUVar3->val)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_198,pcVar2,pcVar2 + (pUVar3->val)._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_178,&pUVar3->keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::vector(&local_160,&pUVar3->values);
  key_00._M_string_length = in_stack_fffffffffffffd30._0_8_;
  key_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffd30._8_16_;
  key_00._M_dataplus._M_p = (pointer)__return_storage_ptr__;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffd80;
  auVar4 = in_stack_fffffffffffffd48._8_32_;
  val_00.typ = in_stack_fffffffffffffd48._0_4_;
  val_00._4_4_ = in_stack_fffffffffffffd48._4_4_;
  val_00.val._M_dataplus._M_p = (pointer)auVar4._0_8_;
  val_00.val._M_string_length = auVar4._8_8_;
  val_00.val.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )auVar4._16_16_;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffd48._40_8_;
  val_00.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffd48._48_8_;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = in_stack_fffffffffffffd88;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start._1_7_ = in_stack_fffffffffffffd89;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = in_stack_fffffffffffffd90;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish._4_4_ = in_stack_fffffffffffffd94;
  val_00.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_fffffffffffffd98;
  UniValue::pushKV(&local_90,key_00,val_00);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_160);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_178);
  if (local_198[0] != local_188) {
    operator_delete(local_198[0],local_188[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if (local_148[0] != local_138) {
    operator_delete(local_148[0],local_138[0] + 1);
  }
  pbVar14 = local_90.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pbVar13 = local_90.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pbVar12 = local_90.keys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  sVar10 = local_90.val._M_string_length;
  _Var9._M_p = local_90.val._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.val._M_dataplus._M_p == paVar1) {
    in_stack_fffffffffffffe08 =
         CONCAT17(local_90.val.field_2._M_local_buf[0xf],
                  CONCAT25(local_90.val.field_2._13_2_,
                           CONCAT41(local_90.val.field_2._9_4_,local_90.val.field_2._M_local_buf[8])
                          ));
    _Var9._M_p = (pointer)&stack0xfffffffffffffe00;
  }
  uVar11._1_7_ = local_90.val.field_2._M_allocated_capacity._1_7_;
  uVar11._0_1_ = local_90.val.field_2._M_local_buf[0];
  local_90.val._M_string_length = 0;
  local_90.val.field_2._M_local_buf[0] = '\0';
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar15 = local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start._0_4_;
  uVar16 = local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start._4_4_;
  uVar17 = local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish._0_4_;
  uVar18 = local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish._4_4_;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_90.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  VVar6 = NullUniValue.typ;
  puVar7 = &stack0xfffffffffffffda8;
  VVar8 = local_90.typ;
  local_90.val._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffd98,NullUniValue.val._M_dataplus._M_p,
             NullUniValue.val._M_dataplus._M_p + NullUniValue.val._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&stack0xfffffffffffffdb8,&NullUniValue.keys);
  std::vector<UniValue,_std::allocator<UniValue>_>::vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffffdd0,
             &NullUniValue.values);
  local_1c0._M_dataplus._M_p._0_4_ = 1;
  UniValue::UniValue<int,_int,_true>((UniValue *)&stack0xfffffffffffffd30,(int *)&local_1c0);
  bVar5 = true;
  result_00.val._0_24_ = in_stack_fffffffffffffd30;
  result_00._0_8_ = __return_storage_ptr__;
  result_00._32_56_ = in_stack_fffffffffffffd48;
  error.val._M_dataplus._M_p._0_1_ = 1;
  error._0_8_ = in_stack_fffffffffffffd80;
  error.val._M_dataplus._M_p._1_7_ = in_stack_fffffffffffffd89;
  error.val._M_string_length._0_4_ = VVar6;
  error.val._M_string_length._4_4_ = in_stack_fffffffffffffd94;
  error.val.field_2._M_allocated_capacity = (size_type)puVar7;
  error.val.field_2._8_8_ = in_stack_fffffffffffffda0;
  error.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffda8;
  error.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffdb0._0_8_;
  error.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffdb0._8_8_;
  error.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)
       (_Vector_base<UniValue,_std::allocator<UniValue>_>)in_stack_fffffffffffffdb0._16_24_;
  id.super__Optional_base<UniValue,_false,_false>._M_payload.
  super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
  _M_payload._M_value.val._M_string_length._0_4_ = VVar8;
  id.super__Optional_base<UniValue,_false,_false>._M_payload.
  super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
  _M_payload._0_16_ = in_stack_fffffffffffffdd8;
  id.super__Optional_base<UniValue,_false,_false>._M_payload.
  super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
  _M_payload._M_value.val._M_string_length._4_4_ = in_stack_fffffffffffffdec;
  id.super__Optional_base<UniValue,_false,_false>._M_payload.
  super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
  _M_payload._24_8_ = _Var9._M_p;
  id.super__Optional_base<UniValue,_false,_false>._M_payload.
  super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
  _M_payload._32_8_ = sVar10;
  id.super__Optional_base<UniValue,_false,_false>._M_payload.
  super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
  _M_payload._M_value.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)uVar11;
  id.super__Optional_base<UniValue,_false,_false>._M_payload.
  super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
  _M_payload._M_value.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffe08;
  id.super__Optional_base<UniValue,_false,_false>._M_payload.
  super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
  _M_payload._M_value.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar12;
  id.super__Optional_base<UniValue,_false,_false>._M_payload.
  super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
  _M_payload._M_value.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)pbVar13;
  id.super__Optional_base<UniValue,_false,_false>._M_payload.
  super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
  _M_payload._M_value.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)pbVar14;
  id.super__Optional_base<UniValue,_false,_false>._M_payload.
  super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
  _M_payload._80_4_ = uVar15;
  id.super__Optional_base<UniValue,_false,_false>._M_payload.
  super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
  _M_payload._84_4_ = uVar16;
  id.super__Optional_base<UniValue,_false,_false>._M_payload.
  super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
  _88_4_ = uVar17;
  id.super__Optional_base<UniValue,_false,_false>._M_payload.
  super__Optional_payload<UniValue,_true,_false,_false>.super__Optional_payload_base<UniValue>.
  _92_4_ = uVar18;
  JSONRPCReplyObj(__return_storage_ptr__,result_00,error,id,(JSONRPCVersion)&stack0xfffffffffffffde8
                 );
  if (bVar5 == true) {
    std::_Optional_payload_base<UniValue>::_M_destroy
              ((_Optional_payload_base<UniValue> *)&stack0xfffffffffffffd30);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffffdd0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffffdb8);
  if (puVar7 != &stack0xfffffffffffffda8) {
    operator_delete(puVar7,in_stack_fffffffffffffda8 + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)&stack0xfffffffffffffe28);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&stack0xfffffffffffffe10);
  if (_Var9._M_p != &stack0xfffffffffffffe00) {
    operator_delete(_Var9._M_p,uVar11 + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_90.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.val._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.val._M_dataplus._M_p,
                    CONCAT71(local_90.val.field_2._M_allocated_capacity._1_7_,
                             local_90.val.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

UniValue ProcessReply(const UniValue &reply) override
    {
        UniValue result(UniValue::VOBJ);
        result.pushKV("address", address_str);
        result.pushKV("blocks", reply.get_obj()["result"]);
        return JSONRPCReplyObj(std::move(result), NullUniValue, /*id=*/1, JSONRPCVersion::V2);
    }